

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O1

void __thiscall
glcts::TessellationShaderInvarianceRule6Test::initTestIterations
          (TessellationShaderInvarianceRule6Test *this)

{
  _tessellation_primitive_mode primitive_mode;
  _tessellation_shader_vertex_ordering _Var1;
  GLfloat aGVar2 [2];
  undefined8 uVar3;
  undefined8 uVar4;
  pointer p_Var5;
  int iVar6;
  deUint32 err;
  undefined4 extraout_var;
  pointer *pp_Var7;
  uint uVar8;
  long lVar9;
  iterator __position;
  vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>>
  *this_00;
  long lVar10;
  GLint gl_max_tess_gen_level_value;
  _test_iteration test;
  undefined1 local_88 [16];
  pointer local_78;
  _tessellation_primitive_mode _Stack_70;
  _tessellation_shader_vertex_ordering _Stack_6c;
  uint local_68;
  long local_60;
  long local_58;
  vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>>
  *local_50;
  pointer *local_48;
  vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>>
  *local_40;
  pointer *local_38;
  
  iVar6 = (*((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar6) + 0x868))
            ((this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.m_glExtTokens.
             MAX_TESS_GEN_LEVEL);
  err = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x800))();
  glu::checkError(err,"glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                  ,0x91a);
  local_38 = &(this->m_test_quads_iterations).
              super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_40 = (vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>>
              *)&this->m_test_quads_iterations;
  local_48 = &(this->m_test_triangles_iterations).
              super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = (vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>>
              *)&this->m_test_triangles_iterations;
  lVar9 = 0;
  do {
    primitive_mode = (&DAT_01b9f42c)[lVar9];
    lVar10 = 0;
    local_60 = lVar9;
    do {
      _Var1 = deqp::gles2::Functional::UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices
              [lVar10];
      TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode
                ((_tessellation_levels_set *)local_88,primitive_mode,0,
                 TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);
      p_Var5 = local_78;
      uVar4 = local_88._8_8_;
      uVar3 = local_88._0_8_;
      uVar8 = (int)((ulong)(local_88._8_8_ - local_88._0_8_) >> 3) * -0x55555555 - 1;
      local_58 = lVar10;
      aGVar2 = (GLfloat  [2])local_88._0_8_;
      if (uVar8 != 0) {
        lVar9 = 0;
        do {
          *(undefined8 *)(local_88._0_8_ + lVar9) =
               *(undefined8 *)((pointer)((ulong)uVar8 * 0x18 + local_88._0_8_))->inner;
          lVar9 = lVar9 + 0x18;
        } while ((ulong)uVar8 * 0x18 != lVar9);
      }
      for (; aGVar2 != (GLfloat  [2])uVar4; aGVar2 = (GLfloat  [2])((long)aGVar2 + 0x18)) {
        local_68 = 0;
        local_88._0_8_ = *(undefined8 *)aGVar2;
        local_88._8_8_ = *(undefined8 *)((long)aGVar2 + 8);
        local_78 = *(pointer *)((long)aGVar2 + 0x10);
        _Stack_6c = _Var1;
        _Stack_70 = primitive_mode;
        if (local_60 == 0) {
          __position._M_current =
               (this->m_test_triangles_iterations).
               super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          pp_Var7 = local_48;
          this_00 = local_50;
          if (__position._M_current ==
              (this->m_test_triangles_iterations).
              super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00d32410;
LAB_00d323d8:
          (__position._M_current)->n_vertices = 0;
          *(pointer *)((__position._M_current)->outer_tess_levels + 2) = local_78;
          (__position._M_current)->primitive_mode = primitive_mode;
          (__position._M_current)->vertex_ordering = _Var1;
          *(undefined8 *)(__position._M_current)->inner_tess_levels = local_88._0_8_;
          *(undefined8 *)(__position._M_current)->outer_tess_levels = local_88._8_8_;
          *pp_Var7 = *pp_Var7 + 1;
        }
        else {
          __position._M_current =
               (this->m_test_quads_iterations).
               super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          pp_Var7 = local_38;
          this_00 = local_40;
          if (__position._M_current !=
              (this->m_test_quads_iterations).
              super__Vector_base<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00d323d8;
LAB_00d32410:
          std::
          vector<glcts::TessellationShaderInvarianceRule6Test::_test_iteration,std::allocator<glcts::TessellationShaderInvarianceRule6Test::_test_iteration>>
          ::_M_realloc_insert<glcts::TessellationShaderInvarianceRule6Test::_test_iteration_const&>
                    (this_00,__position,(_test_iteration *)local_88);
        }
      }
      if ((GLfloat  [2])uVar3 != (GLfloat  [2])0x0) {
        operator_delete((void *)uVar3,(long)p_Var5 - uVar3);
      }
      lVar10 = local_58 + 1;
    } while (local_58 == 0);
    lVar9 = local_60 + 1;
    if (local_60 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void TessellationShaderInvarianceRule6Test::initTestIterations()
{
	DE_ASSERT(m_test_quads_iterations.size() == 0 && m_test_triangles_iterations.size() == 0);

	/* Retrieve GL_MAX_TESS_GEN_LEVEL_EXT value */
	const glw::Functions& gl						  = m_context.getRenderContext().getFunctions();
	glw::GLint			  gl_max_tess_gen_level_value = 0;

	gl.getIntegerv(m_glExtTokens.MAX_TESS_GEN_LEVEL, &gl_max_tess_gen_level_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv() failed for GL_MAX_TESS_GEN_LEVEL_EXT pname");

	/* Iterate through all primitive and vertex spacing modes relevant to the test */
	_tessellation_primitive_mode primitive_modes[] = { TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES,
													   TESSELLATION_SHADER_PRIMITIVE_MODE_QUADS };
	_tessellation_shader_vertex_ordering vertex_ordering_modes[] = { TESSELLATION_SHADER_VERTEX_ORDERING_CCW,
																	 TESSELLATION_SHADER_VERTEX_ORDERING_CW };

	const unsigned int n_primitive_modes = sizeof(primitive_modes) / sizeof(primitive_modes[0]);
	const unsigned int n_vo_modes		 = sizeof(vertex_ordering_modes) / sizeof(vertex_ordering_modes[0]);

	for (unsigned int n_primitive_mode = 0; n_primitive_mode < n_primitive_modes; ++n_primitive_mode)
	{
		_tessellation_primitive_mode primitive_mode = primitive_modes[n_primitive_mode];

		for (unsigned int n_vo_mode = 0; n_vo_mode < n_vo_modes; ++n_vo_mode)
		{
			_tessellation_shader_vertex_ordering vertex_ordering = vertex_ordering_modes[n_vo_mode];

			/* Retrieve inner/outer tessellation level combinations we want the tests to be run for.
			 * Since each level set we will be provided by getTessellationLevelSetForPrimitiveMode()
			 * is unique and does not repeat, we'll just make sure the inner level values are set to
			 * the same set of values, so that the conditions the test must meet are actually met.
			 */
			float*					 inner_levels_to_use = DE_NULL;
			_tessellation_levels_set levels_set;
			unsigned int			 n_levels_sets = 0;

			levels_set = TessellationShaderUtils::getTessellationLevelSetForPrimitiveMode(
				primitive_mode, gl_max_tess_gen_level_value,
				TESSELLATION_LEVEL_SET_FILTER_ALL_LEVELS_USE_THE_SAME_VALUE);

			n_levels_sets		= (unsigned int)levels_set.size();
			inner_levels_to_use = levels_set[n_levels_sets - 1].inner;

			for (unsigned int n_levels_set = 0; n_levels_set < n_levels_sets - 1; n_levels_set++)
			{
				/* Make sure the Utils function was not changed and that inner level values
				 * are actually unique across the whole set */
				DE_ASSERT(levels_set[n_levels_set].inner[0] != levels_set[n_levels_sets - 1].inner[0] &&
						  levels_set[n_levels_set].inner[1] != levels_set[n_levels_sets - 1].inner[1]);

				/* Force the last set's inner values to all level combinations we'll be using */
				memcpy(levels_set[n_levels_set].inner, inner_levels_to_use, sizeof(levels_set[n_levels_set].inner));
			} /* for (all sets retrieved from Utils function */

			for (_tessellation_levels_set_const_iterator set_iterator = levels_set.begin();
				 set_iterator != levels_set.end(); set_iterator++)
			{
				const _tessellation_levels& levels = *set_iterator;

				/* Create a test descriptor for all the parameters we now have */
				_test_iteration test;

				memcpy(test.inner_tess_levels, levels.inner, sizeof(test.inner_tess_levels));
				memcpy(test.outer_tess_levels, levels.outer, sizeof(test.outer_tess_levels));

				test.primitive_mode  = primitive_mode;
				test.vertex_ordering = vertex_ordering;

				if (primitive_mode == TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES)
				{
					m_test_triangles_iterations.push_back(test);
				}
				else
				{
					m_test_quads_iterations.push_back(test);
				}
			} /* for (all level sets) */
		}	 /* for (all vertex ordering modes) */
	}		  /* for (all primitive modes) */
}